

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O2

void * __thiscall
btHashedSimplePairCache::removeOverlappingPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  long lVar1;
  int iVar2;
  btSimplePair *pbVar3;
  int *piVar4;
  anon_union_8_2_fce4e415_for_btSimplePair_2 aVar5;
  uint uVar6;
  btSimplePair *pbVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  void *pvVar13;
  int iVar14;
  
  gRemoveSimplePairs = gRemoveSimplePairs + 1;
  uVar6 = getHash(this,indexA,indexB);
  uVar10 = (long)(int)uVar6 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  pbVar7 = internalFindPair(this,indexA,indexB,(int)uVar10);
  if (pbVar7 == (btSimplePair *)0x0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = (pbVar7->field_2).m_userPointer;
    pbVar3 = (this->m_overlappingPairArray).m_data;
    piVar4 = (this->m_next).m_data;
    iVar14 = (int)((ulong)((long)pbVar7 - (long)pbVar3) >> 4);
    piVar11 = (this->m_hashTable).m_data + uVar10;
    piVar8 = piVar11;
    iVar9 = -1;
    while (iVar2 = *piVar8, iVar2 != iVar14) {
      iVar9 = iVar2;
      piVar8 = piVar4 + iVar2;
    }
    piVar8 = piVar4 + iVar9;
    if (iVar9 == -1) {
      piVar8 = piVar11;
    }
    *piVar8 = piVar4[iVar14];
    lVar12 = (long)(this->m_overlappingPairArray).m_size;
    lVar1 = lVar12 + -1;
    if ((int)lVar1 != iVar14) {
      uVar6 = getHash(this,pbVar3[lVar1].m_indexA,pbVar3[lVar1].m_indexB);
      uVar10 = (long)(int)uVar6 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar4 = (this->m_next).m_data;
      piVar11 = (this->m_hashTable).m_data + uVar10;
      piVar8 = piVar11;
      iVar9 = -1;
      while (iVar2 = *piVar8, iVar2 != (int)lVar1) {
        iVar9 = iVar2;
        piVar8 = piVar4 + iVar2;
      }
      piVar8 = piVar4 + iVar9;
      if (iVar9 == -1) {
        piVar8 = piVar11;
      }
      *piVar8 = piVar4[lVar12 + -1];
      pbVar3 = (this->m_overlappingPairArray).m_data;
      pbVar7 = pbVar3 + lVar1;
      iVar9 = pbVar7->m_indexB;
      aVar5 = pbVar7->field_2;
      pbVar3 = pbVar3 + iVar14;
      pbVar3->m_indexA = pbVar7->m_indexA;
      pbVar3->m_indexB = iVar9;
      pbVar3->field_2 = aVar5;
      piVar8 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar14] = piVar8[uVar10];
      piVar8[uVar10] = iVar14;
      iVar14 = (this->m_overlappingPairArray).m_size + -1;
    }
    (this->m_overlappingPairArray).m_size = iVar14;
  }
  return pvVar13;
}

Assistant:

void* btHashedSimplePairCache::removeOverlappingPair(int indexA, int indexB)
{
	gRemoveSimplePairs++;
	

	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair == NULL)
	{
		return 0;
	}

	
	void* userData = pair->m_userPointer;


	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	int previous = BT_SIMPLE_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btSimplePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_indexA), static_cast<unsigned int>(last->m_indexB)) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	previous = BT_SIMPLE_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}